

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv__handle_fd(uv_handle_t *handle)

{
  uv_handle_type uVar1;
  uv_handle_t *handle_local;
  
  uVar1 = handle->type;
  if ((uVar1 == UV_NAMED_PIPE) || (uVar1 == UV_TCP)) {
    handle_local._4_4_ = handle[1].flags;
  }
  else if (uVar1 == UV_UDP) {
    handle_local._4_4_ = *(uint *)&handle[1].next_closing;
  }
  else {
    handle_local._4_4_ = 0xffffffff;
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__handle_fd(uv_handle_t* handle) {
  switch (handle->type) {
    case UV_NAMED_PIPE:
    case UV_TCP:
      return ((uv_stream_t*) handle)->io_watcher.fd;

    case UV_UDP:
      return ((uv_udp_t*) handle)->io_watcher.fd;

    default:
      return -1;
  }
}